

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressor.cpp
# Opt level: O2

int __thiscall
Imf_2_5::DwaCompressor::uncompress
          (DwaCompressor *this,char *inPtr,int inSize,Box2i *range,char **outPtr)

{
  char *pcVar1;
  char *pcVar2;
  int minY;
  CompressorScheme CVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  unsigned_short *raw;
  pointer pCVar8;
  char *pcVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  char cVar27;
  char cVar28;
  char cVar29;
  char cVar30;
  char cVar31;
  char cVar32;
  char cVar33;
  char cVar34;
  char cVar35;
  char cVar36;
  char cVar37;
  char cVar38;
  char cVar39;
  char cVar40;
  int x;
  int maxY;
  int iVar41;
  int iVar42;
  int iVar43;
  uint uVar44;
  uint uVar45;
  ulong uVar46;
  InputExc *this_00;
  NoImplExc *this_01;
  BaseExc *this_02;
  pointer pCVar47;
  ulong uVar48;
  code *pcVar49;
  uint uVar50;
  ulong uVar51;
  size_t __n;
  ulong uVar52;
  size_type __n_00;
  char *pcVar53;
  undefined *puVar54;
  size_type __n_01;
  undefined1 *toLinear;
  char *pcVar55;
  ulong uVar56;
  pointer pCVar57;
  size_type __n_02;
  int y;
  long lVar58;
  long lVar59;
  reference rVar60;
  char *local_168;
  char *local_158;
  char *outBufferEnd;
  char *dataPtr;
  int local_140;
  int local_13c;
  char *local_138;
  ulong local_130;
  vector<bool,_std::allocator<bool>_> decodedChannels;
  vector<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
  rowPtrs;
  char *src;
  short local_b0;
  int local_ac;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8 [7];
  size_t outBufferSize;
  
  iVar42 = (range->max).x;
  if (this->_max[0] < iVar42) {
    iVar42 = this->_max[0];
  }
  maxY = (range->max).y;
  if (this->_max[1] < maxY) {
    maxY = this->_max[1];
  }
  if ((uint)inSize < 0x58) {
    this_02 = (BaseExc *)__cxa_allocate_exception(0x48);
    pcVar53 = "Error uncompressing DWA data(truncated header).";
  }
  else {
    local_140 = (range->min).x;
    minY = (range->min).y;
    uVar56 = (ulong)inSize;
    for (lVar58 = 0; lVar58 != 0x58; lVar58 = lVar58 + 8) {
      src = inPtr + lVar58;
      Xdr::read<Imf_2_5::CharPtrIO,char_const*>(&src,(unsigned_long *)src);
    }
    uVar51 = *(ulong *)inPtr;
    pcVar53 = *(char **)(inPtr + 8);
    uVar46 = *(ulong *)(inPtr + 0x10);
    uVar48 = *(ulong *)(inPtr + 0x18);
    uVar5 = *(ulong *)(inPtr + 0x20);
    uVar6 = *(ulong *)(inPtr + 0x28);
    local_138 = *(char **)(inPtr + 0x30);
    local_130 = *(ulong *)(inPtr + 0x38);
    lVar58 = *(long *)(inPtr + 0x40);
    lVar59 = *(long *)(inPtr + 0x48);
    lVar7 = *(long *)(inPtr + 0x50);
    dataPtr = inPtr + 0x58;
    local_13c = iVar42;
    if ((((uVar56 < uVar6) || (uVar56 < uVar5)) || (uVar56 < uVar48)) ||
       ((uVar56 < uVar46 || (uVar52 = uVar6 + uVar48 + uVar46 + uVar5 + 0x58, uVar56 < uVar52)))) {
      this_02 = (BaseExc *)__cxa_allocate_exception(0x48);
      pcVar53 = "Error uncompressing DWA data(truncated file).";
    }
    else if ((((long)(uVar48 | uVar5 | uVar46 | (ulong)pcVar53 | uVar6) < 0) ||
             ((long)local_138 < 0)) || (((long)local_130 < 0 || ((lVar58 < 0 || (lVar59 < 0)))))) {
      this_02 = (BaseExc *)__cxa_allocate_exception(0x48);
      pcVar53 = "Error uncompressing DWA data (corrupt header).";
    }
    else if (uVar51 < 2) {
      initializeLegacyChannelRules(this);
LAB_003e6763:
      outBufferSize = 0;
      initializeBuffers(this,&outBufferSize);
      iVar42 = this->_maxScanLineSize;
      iVar41 = (*(this->super_Compressor)._vptr_Compressor[2])(this);
      iVar43 = local_13c;
      if (this->_outBufferSize < (ulong)((long)iVar41 * (long)iVar42)) {
        iVar42 = this->_maxScanLineSize;
        iVar41 = (*(this->super_Compressor)._vptr_Compressor[2])(this);
        this->_outBufferSize = (long)iVar41 * (long)iVar42;
        if (this->_outBuffer != (char *)0x0) {
          operator_delete__(this->_outBuffer);
        }
        iVar42 = this->_maxScanLineSize;
        iVar41 = (*(this->super_Compressor)._vptr_Compressor[2])(this);
        outBufferEnd = (char *)operator_new__((long)iVar41 * (long)iVar42);
        this->_outBuffer = outBufferEnd;
      }
      else {
        outBufferEnd = this->_outBuffer;
      }
      pcVar55 = dataPtr;
      if (uVar51 < 3) {
        local_168 = this->_packedAcBuffer;
        local_158 = this->_packedDcBuffer;
        setupChannelData(this,local_140,minY,iVar43,maxY);
        if (uVar46 == 0) {
LAB_003e691d:
          pcVar55 = pcVar55 + uVar46;
          if (uVar48 != 0) {
            raw = (unsigned_short *)this->_packedAcBuffer;
            if ((raw == (unsigned_short *)0x0) ||
               ((char *)this->_packedAcBufferSize < (char *)(lVar58 * 2))) goto LAB_003e71e6;
            if (lVar7 == 1) {
              src = (char *)((long)(int)lVar58 * 2);
              iVar42 = ::uncompress(raw,&src,pcVar55,uVar48);
              if (iVar42 == 0) {
                if ((char *)(lVar58 * 2) == src) goto LAB_003e69b3;
                this_02 = (BaseExc *)__cxa_allocate_exception(0x48);
                pcVar53 = "AC data corrupt.";
              }
              else {
                this_02 = (BaseExc *)__cxa_allocate_exception(0x48);
                pcVar53 = "Data decompression (zlib) failed.";
              }
              goto LAB_003e71f8;
            }
            if (lVar7 != 0) {
              this_02 = (BaseExc *)__cxa_allocate_exception(0x48);
              Iex_2_5::NoImplExc::NoImplExc((NoImplExc *)this_02,"Unknown AC Compression");
              puVar54 = &Iex_2_5::NoImplExc::typeinfo;
              pcVar49 = Iex_2_5::NoImplExc::~NoImplExc;
              goto LAB_003e724e;
            }
            hufUncompress(pcVar55,(int)uVar48,raw,(int)lVar58);
          }
LAB_003e69b3:
          uVar56 = local_130;
          pcVar53 = local_138;
          if (uVar5 != 0) {
            uVar51 = lVar59 * 2;
            if (this->_packedDcBufferSize < uVar51) goto LAB_003e71e6;
            iVar42 = Zip::uncompress(this->_zip,pcVar55 + uVar48,(int)uVar5,this->_packedDcBuffer);
            if (uVar51 != (long)iVar42) {
              this_02 = (BaseExc *)__cxa_allocate_exception(0x48);
              pcVar53 = "DC data corrupt.";
              goto LAB_003e7238;
            }
          }
          if (uVar56 == 0) {
LAB_003e6a77:
            std::vector<bool,_std::allocator<bool>_>::vector
                      (&decodedChannels,
                       ((long)(this->_channelData).
                              super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->_channelData).
                             super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0x98,
                       (allocator_type *)&src);
            std::
            vector<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
            ::vector(&rowPtrs,((long)(this->_channelData).
                                     super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->_channelData).
                                    super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                                    ._M_impl.super__Vector_impl_data._M_start) / 0x98,
                     (allocator_type *)&src);
            uVar50 = 0;
            while( true ) {
              pCVar57 = (this->_channelData).
                        super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pCVar47 = (this->_channelData).
                        super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              if ((ulong)(((long)pCVar47 - (long)pCVar57) / 0x98) <= (ulong)uVar50) break;
              rVar60 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                 (&decodedChannels,(ulong)uVar50);
              *rVar60._M_p = *rVar60._M_p & ~rVar60._M_mask;
              uVar50 = uVar50 + 1;
            }
            outBufferEnd = this->_outBuffer;
            for (iVar42 = minY; iVar42 <= maxY; iVar42 = iVar42 + 1) {
              for (uVar50 = 0; uVar56 = (ulong)uVar50,
                  uVar56 < (ulong)(((long)pCVar47 - (long)pCVar57) / 0x98); uVar50 = uVar50 + 1) {
                iVar43 = Imath_2_5::modp(iVar42,pCVar57[uVar56].ySampling);
                if (iVar43 == 0) {
                  std::vector<char_*,_std::allocator<char_*>_>::push_back
                            (rowPtrs.
                             super__Vector_base<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + uVar56,&outBufferEnd);
                  iVar43 = pCVar57[uVar56].width;
                  iVar41 = pixelTypeSize(pCVar57[uVar56].type);
                  outBufferEnd = outBufferEnd + (long)iVar41 * (long)iVar43;
                }
                pCVar57 = (this->_channelData).
                          super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                pCVar47 = (this->_channelData).
                          super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
              }
            }
            uVar50 = 0;
            while( true ) {
              uVar56 = (ulong)uVar50;
              pCVar8 = (this->_cscSets).
                       super__Vector_base<Imf_2_5::DwaCompressor::CscChannelSet,_std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if ((ulong)(((long)(this->_cscSets).
                                 super__Vector_base<Imf_2_5::DwaCompressor::CscChannelSet,_std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar8) / 0xc)
                  <= uVar56) break;
              __n_00 = (size_type)pCVar8[uVar56].idx[0];
              __n_02 = (size_type)pCVar8[uVar56].idx[1];
              __n_01 = (size_type)pCVar8[uVar56].idx[2];
              pCVar57 = (this->_channelData).
                        super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              LossyDctDecoderCsc::LossyDctDecoderCsc
                        ((LossyDctDecoderCsc *)&src,
                         rowPtrs.
                         super__Vector_base<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + __n_00,
                         rowPtrs.
                         super__Vector_base<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + __n_02,
                         rowPtrs.
                         super__Vector_base<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + __n_01,local_168,local_158,
                         (unsigned_short *)dwaCompressorToLinear,pCVar57[__n_00].width,
                         pCVar57[__n_00].height,pCVar57[__n_00].type,pCVar57[__n_02].type,
                         pCVar57[__n_01].type);
              LossyDctDecoderBase::execute((LossyDctDecoderBase *)&src);
              lVar59 = (long)local_ac;
              lVar58 = (long)(int)local_a8[0]._0_4_;
              rVar60 = std::vector<bool,_std::allocator<bool>_>::operator[](&decodedChannels,__n_00)
              ;
              *rVar60._M_p = *rVar60._M_p | rVar60._M_mask;
              rVar60 = std::vector<bool,_std::allocator<bool>_>::operator[](&decodedChannels,__n_02)
              ;
              *rVar60._M_p = *rVar60._M_p | rVar60._M_mask;
              rVar60 = std::vector<bool,_std::allocator<bool>_>::operator[](&decodedChannels,__n_01)
              ;
              local_168 = local_168 + lVar59 * 2;
              local_158 = local_158 + lVar58 * 2;
              *rVar60._M_p = *rVar60._M_p | rVar60._M_mask;
              LossyDctDecoderBase::~LossyDctDecoderBase((LossyDctDecoderBase *)&src);
              uVar50 = uVar50 + 1;
            }
            uVar50 = 0;
            do {
              uVar56 = (ulong)uVar50;
              if ((ulong)(((long)(this->_channelData).
                                 super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->_channelData).
                                super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                                ._M_impl.super__Vector_impl_data._M_start) / 0x98) <= uVar56) {
                pcVar53 = this->_outBuffer;
                *outPtr = pcVar53;
                iVar42 = (int)outBufferEnd - (int)pcVar53;
                std::
                vector<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
                ::~vector(&rowPtrs);
                std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                          (&decodedChannels.super__Bvector_base<std::allocator<bool>_>);
                return iVar42;
              }
              rVar60 = std::vector<bool,_std::allocator<bool>_>::operator[](&decodedChannels,uVar56)
              ;
              if ((*rVar60._M_p & rVar60._M_mask) == 0) {
                pCVar57 = (this->_channelData).
                          super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                uVar44 = pixelTypeSize(pCVar57[uVar56].type);
                CVar3 = pCVar57[uVar56].compression;
                if (CVar3 == UNKNOWN) {
                  iVar42 = pCVar57[uVar56].width;
                  iVar43 = pixelTypeSize(pCVar57[uVar56].type);
                  __n = (long)iVar43 * (long)iVar42;
                  iVar43 = 0;
                  for (iVar42 = minY; iVar42 <= maxY; iVar42 = iVar42 + 1) {
                    iVar41 = Imath_2_5::modp(iVar42,pCVar57[uVar56].ySampling);
                    if (iVar41 == 0) {
                      if (this->_planarUncBuffer[0] + this->_planarUncBufferSize[0] <
                          pCVar57[uVar56].planarUncBufferEnd + __n) {
                        this_00 = (InputExc *)__cxa_allocate_exception(0x48);
                        Iex_2_5::InputExc::InputExc(this_00,"DWA data corrupt");
                        __cxa_throw(this_00,&Iex_2_5::InputExc::typeinfo,
                                    Iex_2_5::InputExc::~InputExc);
                      }
                      memcpy(rowPtrs.
                             super__Vector_base<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar56].
                             super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                             super__Vector_impl_data._M_start[iVar43],
                             pCVar57[uVar56].planarUncBufferEnd,__n);
                      pCVar57[uVar56].planarUncBufferEnd = pCVar57[uVar56].planarUncBufferEnd + __n;
                      iVar43 = iVar43 + 1;
                    }
                  }
                }
                else if (CVar3 == LOSSY_DCT) {
                  toLinear = dwaCompressorToLinear;
                  if (pCVar57[uVar56].pLinear != false) {
                    toLinear = (undefined1 *)0x0;
                  }
                  LossyDctDecoder::LossyDctDecoder
                            ((LossyDctDecoder *)&src,
                             rowPtrs.
                             super__Vector_base<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + uVar56,local_168,local_158,
                             (unsigned_short *)toLinear,pCVar57[uVar56].width,pCVar57[uVar56].height
                             ,pCVar57[uVar56].type);
                  LossyDctDecoderBase::execute((LossyDctDecoderBase *)&src);
                  local_168 = local_168 + (long)local_ac * 2;
                  local_158 = local_158 + (long)(int)local_a8[0]._0_4_ * 2;
                  LossyDctDecoderBase::~LossyDctDecoderBase((LossyDctDecoderBase *)&src);
                }
                else {
                  if (CVar3 != RLE) {
                    this_01 = (NoImplExc *)__cxa_allocate_exception(0x48);
                    Iex_2_5::NoImplExc::NoImplExc(this_01,"Unhandled compression scheme case");
                    __cxa_throw(this_01,&Iex_2_5::NoImplExc::typeinfo,Iex_2_5::NoImplExc::~NoImplExc
                               );
                  }
                  iVar42 = 0;
                  uVar51 = 0;
                  iVar43 = minY;
                  if (0 < (int)uVar44) {
                    uVar51 = (ulong)uVar44;
                  }
                  for (; iVar43 <= maxY; iVar43 = iVar43 + 1) {
                    iVar41 = Imath_2_5::modp(iVar43,pCVar57[uVar56].ySampling);
                    if (iVar41 == 0) {
                      pcVar53 = rowPtrs.
                                super__Vector_base<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar56].
                                super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                                super__Vector_impl_data._M_start[iVar42];
                      if (uVar44 == 2) {
                        pcVar55 = pCVar57[uVar56].planarUncRleEnd[0];
                        pcVar9 = pCVar57[uVar56].planarUncRleEnd[1];
                        uVar4 = pCVar57[uVar56].width;
                        lVar58 = (long)(int)uVar4;
                        uVar46 = (long)(int)uVar4 / 0x10;
                        iVar41 = (int)uVar46;
                        if ((((uint)pcVar55 | (uint)pcVar9 | (uint)pcVar53) & 0xf) == 0) {
                          uVar48 = 0;
                          if (0 < iVar41) {
                            uVar48 = uVar46 & 0xffffffff;
                          }
                          for (lVar59 = 0; uVar48 * 0x10 != lVar59; lVar59 = lVar59 + 0x10) {
                            pcVar1 = pcVar55 + lVar59;
                            cVar10 = pcVar1[1];
                            cVar11 = pcVar1[2];
                            cVar12 = pcVar1[3];
                            cVar13 = pcVar1[4];
                            cVar14 = pcVar1[5];
                            cVar15 = pcVar1[6];
                            cVar16 = pcVar1[7];
                            cVar17 = pcVar1[8];
                            cVar18 = pcVar1[9];
                            cVar19 = pcVar1[10];
                            cVar20 = pcVar1[0xb];
                            cVar21 = pcVar1[0xc];
                            cVar22 = pcVar1[0xd];
                            cVar23 = pcVar1[0xe];
                            cVar24 = pcVar1[0xf];
                            pcVar2 = pcVar9 + lVar59;
                            cVar25 = *pcVar2;
                            cVar26 = pcVar2[1];
                            cVar27 = pcVar2[2];
                            cVar28 = pcVar2[3];
                            cVar29 = pcVar2[4];
                            cVar30 = pcVar2[5];
                            cVar31 = pcVar2[6];
                            cVar32 = pcVar2[7];
                            cVar33 = pcVar2[8];
                            cVar34 = pcVar2[9];
                            cVar35 = pcVar2[10];
                            cVar36 = pcVar2[0xb];
                            cVar37 = pcVar2[0xc];
                            cVar38 = pcVar2[0xd];
                            cVar39 = pcVar2[0xe];
                            cVar40 = pcVar2[0xf];
                            pcVar2 = pcVar53 + lVar59 * 2;
                            *pcVar2 = *pcVar1;
                            pcVar2[1] = cVar25;
                            pcVar2[2] = cVar10;
                            pcVar2[3] = cVar26;
                            pcVar2[4] = cVar11;
                            pcVar2[5] = cVar27;
                            pcVar2[6] = cVar12;
                            pcVar2[7] = cVar28;
                            pcVar2[8] = cVar13;
                            pcVar2[9] = cVar29;
                            pcVar2[10] = cVar14;
                            pcVar2[0xb] = cVar30;
                            pcVar2[0xc] = cVar15;
                            pcVar2[0xd] = cVar31;
                            pcVar2[0xe] = cVar16;
                            pcVar2[0xf] = cVar32;
                            pcVar1 = pcVar53 + lVar59 * 2 + 0x10;
                            *pcVar1 = cVar17;
                            pcVar1[1] = cVar33;
                            pcVar1[2] = cVar18;
                            pcVar1[3] = cVar34;
                            pcVar1[4] = cVar19;
                            pcVar1[5] = cVar35;
                            pcVar1[6] = cVar20;
                            pcVar1[7] = cVar36;
                            pcVar1[8] = cVar21;
                            pcVar1[9] = cVar37;
                            pcVar1[10] = cVar22;
                            pcVar1[0xb] = cVar38;
                            pcVar1[0xc] = cVar23;
                            pcVar1[0xd] = cVar39;
                            pcVar1[0xe] = cVar24;
                            pcVar1[0xf] = cVar40;
                          }
                          for (lVar59 = (long)(iVar41 << 4); lVar59 < lVar58; lVar59 = lVar59 + 1) {
                            pcVar53[lVar59 * 2] = pcVar55[lVar59];
                            pcVar53[lVar59 * 2 + 1] = pcVar9[lVar59];
                          }
                        }
                        else if (((((ulong)pcVar53 & 0xf) == 0) && (((uint)pcVar55 & 0xf) == 8)) &&
                                (((uint)pcVar9 & 0xf) == 8)) {
                          uVar45 = 8;
                          if ((int)uVar4 < 8) {
                            uVar45 = uVar4;
                          }
                          uVar46 = (ulong)uVar45;
                          if ((int)uVar45 < 1) {
                            uVar46 = 0;
                          }
                          for (uVar48 = 0; uVar46 != uVar48; uVar48 = uVar48 + 1) {
                            pcVar53[uVar48 * 2] = pcVar55[uVar48];
                            pcVar53[uVar48 * 2 + 1] = pcVar9[uVar48];
                          }
                          if (8 < (int)uVar4) {
                            for (uVar46 = 0; ((uint)(lVar58 - 8U) & 0xfffffff0) != uVar46;
                                uVar46 = uVar46 + 0x10) {
                              pcVar1 = pcVar55 + uVar46 + 8;
                              cVar10 = pcVar1[1];
                              cVar11 = pcVar1[2];
                              cVar12 = pcVar1[3];
                              cVar13 = pcVar1[4];
                              cVar14 = pcVar1[5];
                              cVar15 = pcVar1[6];
                              cVar16 = pcVar1[7];
                              pcVar2 = pcVar9 + uVar46 + 8;
                              cVar17 = *pcVar2;
                              cVar18 = pcVar2[1];
                              cVar19 = pcVar2[2];
                              cVar20 = pcVar2[3];
                              cVar21 = pcVar2[4];
                              cVar22 = pcVar2[5];
                              cVar23 = pcVar2[6];
                              cVar24 = pcVar2[7];
                              pcVar2 = pcVar53 + uVar46 * 2 + 0x10;
                              *pcVar2 = *pcVar1;
                              pcVar2[1] = cVar17;
                              pcVar2[2] = cVar10;
                              pcVar2[3] = cVar18;
                              pcVar2[4] = cVar11;
                              pcVar2[5] = cVar19;
                              pcVar2[6] = cVar12;
                              pcVar2[7] = cVar20;
                              pcVar2[8] = cVar13;
                              pcVar2[9] = cVar21;
                              pcVar2[10] = cVar14;
                              pcVar2[0xb] = cVar22;
                              pcVar2[0xc] = cVar15;
                              pcVar2[0xd] = cVar23;
                              pcVar2[0xe] = cVar16;
                              pcVar2[0xf] = cVar24;
                              cVar10 = pcVar55[uVar46 + 0x11];
                              cVar11 = pcVar55[uVar46 + 0x12];
                              cVar12 = pcVar55[uVar46 + 0x13];
                              cVar13 = pcVar55[uVar46 + 0x14];
                              cVar14 = pcVar55[uVar46 + 0x15];
                              cVar15 = pcVar55[uVar46 + 0x16];
                              cVar16 = pcVar55[uVar46 + 0x17];
                              cVar17 = pcVar9[uVar46 + 0x10];
                              cVar18 = pcVar9[uVar46 + 0x11];
                              cVar19 = pcVar9[uVar46 + 0x12];
                              cVar20 = pcVar9[uVar46 + 0x13];
                              cVar21 = pcVar9[uVar46 + 0x14];
                              cVar22 = pcVar9[uVar46 + 0x15];
                              cVar23 = pcVar9[uVar46 + 0x16];
                              cVar24 = pcVar9[uVar46 + 0x17];
                              pcVar1 = pcVar53 + uVar46 * 2 + 0x20;
                              *pcVar1 = pcVar55[uVar46 + 0x10];
                              pcVar1[1] = cVar17;
                              pcVar1[2] = cVar10;
                              pcVar1[3] = cVar18;
                              pcVar1[4] = cVar11;
                              pcVar1[5] = cVar19;
                              pcVar1[6] = cVar12;
                              pcVar1[7] = cVar20;
                              pcVar1[8] = cVar13;
                              pcVar1[9] = cVar21;
                              pcVar1[10] = cVar14;
                              pcVar1[0xb] = cVar22;
                              pcVar1[0xc] = cVar15;
                              pcVar1[0xd] = cVar23;
                              pcVar1[0xe] = cVar16;
                              pcVar1[0xf] = cVar24;
                            }
                            for (uVar46 = lVar58 - 8U & 0xfffffffffffffff0 | 8;
                                (long)uVar46 < lVar58; uVar46 = uVar46 + 1) {
                              pcVar53[uVar46 * 2] = pcVar55[uVar46];
                              pcVar53[uVar46 * 2 + 1] = pcVar9[uVar46];
                            }
                          }
                        }
                        else {
                          uVar48 = 0;
                          if (0 < iVar41) {
                            uVar48 = uVar46 & 0xffffffff;
                          }
                          for (lVar59 = 0; uVar48 * 0x10 != lVar59; lVar59 = lVar59 + 0x10) {
                            pcVar1 = pcVar55 + lVar59;
                            cVar10 = pcVar1[1];
                            cVar11 = pcVar1[2];
                            cVar12 = pcVar1[3];
                            cVar13 = pcVar1[4];
                            cVar14 = pcVar1[5];
                            cVar15 = pcVar1[6];
                            cVar16 = pcVar1[7];
                            cVar17 = pcVar1[8];
                            cVar18 = pcVar1[9];
                            cVar19 = pcVar1[10];
                            cVar20 = pcVar1[0xb];
                            cVar21 = pcVar1[0xc];
                            cVar22 = pcVar1[0xd];
                            cVar23 = pcVar1[0xe];
                            cVar24 = pcVar1[0xf];
                            pcVar2 = pcVar9 + lVar59;
                            cVar25 = *pcVar2;
                            cVar26 = pcVar2[1];
                            cVar27 = pcVar2[2];
                            cVar28 = pcVar2[3];
                            cVar29 = pcVar2[4];
                            cVar30 = pcVar2[5];
                            cVar31 = pcVar2[6];
                            cVar32 = pcVar2[7];
                            cVar33 = pcVar2[8];
                            cVar34 = pcVar2[9];
                            cVar35 = pcVar2[10];
                            cVar36 = pcVar2[0xb];
                            cVar37 = pcVar2[0xc];
                            cVar38 = pcVar2[0xd];
                            cVar39 = pcVar2[0xe];
                            cVar40 = pcVar2[0xf];
                            pcVar2 = pcVar53 + lVar59 * 2;
                            *pcVar2 = *pcVar1;
                            pcVar2[1] = cVar25;
                            pcVar2[2] = cVar10;
                            pcVar2[3] = cVar26;
                            pcVar2[4] = cVar11;
                            pcVar2[5] = cVar27;
                            pcVar2[6] = cVar12;
                            pcVar2[7] = cVar28;
                            pcVar2[8] = cVar13;
                            pcVar2[9] = cVar29;
                            pcVar2[10] = cVar14;
                            pcVar2[0xb] = cVar30;
                            pcVar2[0xc] = cVar15;
                            pcVar2[0xd] = cVar31;
                            pcVar2[0xe] = cVar16;
                            pcVar2[0xf] = cVar32;
                            pcVar1 = pcVar53 + lVar59 * 2 + 0x10;
                            *pcVar1 = cVar17;
                            pcVar1[1] = cVar33;
                            pcVar1[2] = cVar18;
                            pcVar1[3] = cVar34;
                            pcVar1[4] = cVar19;
                            pcVar1[5] = cVar35;
                            pcVar1[6] = cVar20;
                            pcVar1[7] = cVar36;
                            pcVar1[8] = cVar21;
                            pcVar1[9] = cVar37;
                            pcVar1[10] = cVar22;
                            pcVar1[0xb] = cVar38;
                            pcVar1[0xc] = cVar23;
                            pcVar1[0xd] = cVar39;
                            pcVar1[0xe] = cVar24;
                            pcVar1[0xf] = cVar40;
                          }
                          for (lVar59 = (long)(iVar41 << 4); lVar59 < lVar58; lVar59 = lVar59 + 1) {
                            pcVar53[lVar59 * 2] = pcVar55[lVar59];
                            pcVar53[lVar59 * 2 + 1] = pcVar9[lVar59];
                          }
                        }
                        pCVar57[uVar56].planarUncRleEnd[0] =
                             pCVar57[uVar56].planarUncRleEnd[0] + pCVar57[uVar56].width;
                        pCVar57[uVar56].planarUncRleEnd[1] =
                             pCVar57[uVar56].planarUncRleEnd[1] + pCVar57[uVar56].width;
                      }
                      else {
                        for (iVar41 = 0; iVar41 < pCVar57[uVar56].width; iVar41 = iVar41 + 1) {
                          for (uVar46 = 0; uVar51 != uVar46; uVar46 = uVar46 + 1) {
                            pcVar55 = pCVar57[uVar56].planarUncRleEnd[uVar46];
                            pCVar57[uVar56].planarUncRleEnd[uVar46] = pcVar55 + 1;
                            pcVar53[uVar46] = *pcVar55;
                          }
                          pcVar53 = pcVar53 + uVar46;
                        }
                      }
                      iVar42 = iVar42 + 1;
                    }
                  }
                }
                rVar60 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                   (&decodedChannels,uVar56);
                *rVar60._M_p = *rVar60._M_p | rVar60._M_mask;
              }
              uVar50 = uVar50 + 1;
            } while( true );
          }
          if (((char *)this->_rleBufferSize < pcVar53) || (this->_planarUncBufferSize[2] < uVar56))
          goto LAB_003e71e6;
          src = pcVar53;
          iVar42 = ::uncompress(this->_rleBuffer,&src,pcVar55 + uVar48 + uVar5,uVar6);
          if (iVar42 == 0) {
            if ((src == pcVar53) &&
               (iVar42 = rleUncompress((int)pcVar53,(int)uVar56,this->_rleBuffer,
                                       this->_planarUncBuffer[2]), uVar56 == (long)iVar42))
            goto LAB_003e6a77;
            this_02 = (BaseExc *)__cxa_allocate_exception(0x48);
            pcVar53 = "RLE data corrupted";
          }
          else {
            this_02 = (BaseExc *)__cxa_allocate_exception(0x48);
            pcVar53 = "Error uncompressing RLE data.";
          }
        }
        else {
          if ((char *)this->_planarUncBufferSize[0] < pcVar53) {
LAB_003e71e6:
            this_02 = (BaseExc *)__cxa_allocate_exception(0x48);
            pcVar53 = "Error uncompressing DWA data(corrupt header).";
            goto LAB_003e71f8;
          }
          src = pcVar53;
          iVar42 = ::uncompress(this->_planarUncBuffer[0],&src,pcVar55,uVar46);
          if (iVar42 == 0) goto LAB_003e691d;
          this_02 = (BaseExc *)__cxa_allocate_exception(0x48);
          pcVar53 = "Error uncompressing UNKNOWN data.";
        }
LAB_003e7238:
        Iex_2_5::BaseExc::BaseExc(this_02,pcVar53);
        puVar54 = &Iex_2_5::BaseExc::typeinfo;
        pcVar49 = Iex_2_5::BaseExc::~BaseExc;
        goto LAB_003e724e;
      }
      this_02 = (BaseExc *)__cxa_allocate_exception(0x48);
      pcVar53 = "Invalid version of compressed data block";
    }
    else {
      decodedChannels.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p._0_2_ = 0;
      Xdr::read<Imf_2_5::CharPtrIO,char_const*>(&dataPtr,(unsigned_short *)&decodedChannels);
      if ((ulong)(ushort)decodedChannels.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p < 2) {
        this_02 = (BaseExc *)__cxa_allocate_exception(0x48);
        pcVar53 = "Error uncompressing DWA data (corrupt header file).";
      }
      else {
        if (uVar52 + (ushort)decodedChannels.super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p <=
            uVar56) {
          std::
          vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>
          ::clear(&this->_channelRules);
          decodedChannels.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._0_2_ =
               (ushort)decodedChannels.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p - 2;
          while ((ushort)decodedChannels.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != 0) {
            Classifier::Classifier
                      ((Classifier *)&src,&dataPtr,
                       (uint)(ushort)decodedChannels.super__Bvector_base<std::allocator<bool>_>.
                                     _M_impl.super__Bvector_impl_data._M_start.
                                     super__Bit_iterator_base._M_p);
            std::
            vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>
            ::push_back(&this->_channelRules,(Classifier *)&src);
            decodedChannels.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._0_2_ =
                 ((ushort)decodedChannels.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p - local_b0
                 ) - 3;
            std::__cxx11::string::~string((string *)&src);
          }
          goto LAB_003e6763;
        }
        this_02 = (BaseExc *)__cxa_allocate_exception(0x48);
        pcVar53 = "Error uncompressing DWA data (truncated file).";
      }
    }
  }
LAB_003e71f8:
  Iex_2_5::InputExc::InputExc((InputExc *)this_02,pcVar53);
  puVar54 = &Iex_2_5::InputExc::typeinfo;
  pcVar49 = Iex_2_5::InputExc::~InputExc;
LAB_003e724e:
  __cxa_throw(this_02,puVar54,pcVar49);
}

Assistant:

int 
DwaCompressor::uncompress
    (const char *inPtr,
     int inSize,
     IMATH_NAMESPACE::Box2i range,
     const char *&outPtr)
{
    int minX = range.min.x;
    int maxX = std::min (range.max.x, _max[0]);
    int minY = range.min.y;
    int maxY = std::min (range.max.y, _max[1]);

    Int64 iSize = static_cast<Int64>( inSize );
    Int64 headerSize = NUM_SIZES_SINGLE*sizeof(Int64);
    if (iSize < headerSize) 
    {
        throw IEX_NAMESPACE::InputExc("Error uncompressing DWA data"
                            "(truncated header).");
    }

    // 
    // Flip the counters from XDR to NATIVE
    //

    for (int i = 0; i < NUM_SIZES_SINGLE; ++i)
    {
        Int64      *dst =  (((Int64 *)inPtr) + i);
        const char *src = (char *)(((Int64 *)inPtr) + i);

        Xdr::read<CharPtrIO> (src, *dst);
    }

    //
    // Unwind all the counter info
    //

    const Int64 *inPtr64 = (const Int64*) inPtr;

    Int64 version                  = *(inPtr64 + VERSION);
    Int64 unknownUncompressedSize  = *(inPtr64 + UNKNOWN_UNCOMPRESSED_SIZE);
    Int64 unknownCompressedSize    = *(inPtr64 + UNKNOWN_COMPRESSED_SIZE);
    Int64 acCompressedSize         = *(inPtr64 + AC_COMPRESSED_SIZE);
    Int64 dcCompressedSize         = *(inPtr64 + DC_COMPRESSED_SIZE);
    Int64 rleCompressedSize        = *(inPtr64 + RLE_COMPRESSED_SIZE);
    Int64 rleUncompressedSize      = *(inPtr64 + RLE_UNCOMPRESSED_SIZE);
    Int64 rleRawSize               = *(inPtr64 + RLE_RAW_SIZE);
 
    Int64 totalAcUncompressedCount = *(inPtr64 + AC_UNCOMPRESSED_COUNT); 
    Int64 totalDcUncompressedCount = *(inPtr64 + DC_UNCOMPRESSED_COUNT); 

    Int64 acCompression            = *(inPtr64 + AC_COMPRESSION); 

    Int64 compressedSize           = unknownCompressedSize + 
                                     acCompressedSize +
                                     dcCompressedSize +
                                     rleCompressedSize;

    const char *dataPtr            = inPtr + NUM_SIZES_SINGLE * sizeof(Int64);

    /* Both the sum and individual sizes are checked in case of overflow. */
    if (iSize < (headerSize + compressedSize) ||
        iSize < unknownCompressedSize ||
        iSize < acCompressedSize ||
        iSize < dcCompressedSize ||
        iSize < rleCompressedSize)
    {
        throw IEX_NAMESPACE::InputExc("Error uncompressing DWA data"
                            "(truncated file).");
    }

    if ((SInt64)unknownUncompressedSize < 0  ||
        (SInt64)unknownCompressedSize < 0    ||
        (SInt64)acCompressedSize < 0         ||
        (SInt64)dcCompressedSize < 0         ||
        (SInt64)rleCompressedSize < 0        ||
        (SInt64)rleUncompressedSize < 0      ||
        (SInt64)rleRawSize < 0               ||
        (SInt64)totalAcUncompressedCount < 0 ||
        (SInt64)totalDcUncompressedCount < 0)
    {
        throw IEX_NAMESPACE::InputExc("Error uncompressing DWA data"
                            " (corrupt header).");
    }

    if (version < 2) 
        initializeLegacyChannelRules();
    else
    {
        unsigned short ruleSize = 0;
        Xdr::read<CharPtrIO>(dataPtr, ruleSize);

        if (ruleSize < Xdr::size<unsigned short>() ) 
            throw IEX_NAMESPACE::InputExc("Error uncompressing DWA data"
                                " (corrupt header file).");

        headerSize += ruleSize;
        if (iSize < headerSize + compressedSize)
            throw IEX_NAMESPACE::InputExc("Error uncompressing DWA data"
                                " (truncated file).");

        _channelRules.clear();
        ruleSize -= Xdr::size<unsigned short> ();
        while (ruleSize > 0) 
        {
            Classifier rule(dataPtr, ruleSize);
            
            _channelRules.push_back(rule);
            ruleSize -= rule.size();
        }
    }


    size_t outBufferSize = 0;
    initializeBuffers(outBufferSize);

    //
    // Allocate _outBuffer, if we haven't done so already
    //

    if (static_cast<size_t>(_maxScanLineSize * numScanLines()) > _outBufferSize) 
    {
        _outBufferSize = static_cast<size_t>(_maxScanLineSize * numScanLines());
        if (_outBuffer != 0)
            delete[] _outBuffer;
        _outBuffer = new char[_maxScanLineSize * numScanLines()];
    }


    char *outBufferEnd = _outBuffer;

       
    //
    // Find the start of the RLE packed AC components and
    // the DC components for each channel. This will be handy   
    // if you want to decode the channels in parallel later on.
    //

    char *packedAcBufferEnd = 0; 

    if (_packedAcBuffer)
        packedAcBufferEnd = _packedAcBuffer;

    char *packedDcBufferEnd = 0;

    if (_packedDcBuffer)
        packedDcBufferEnd = _packedDcBuffer;

    //
    // UNKNOWN data is packed first, followed by the 
    // Huffman-compressed AC, then the DC values, 
    // and then the zlib compressed RLE data.
    //
    
    const char *compressedUnknownBuf = dataPtr;

    const char *compressedAcBuf      = compressedUnknownBuf + 
                                  static_cast<ptrdiff_t>(unknownCompressedSize);
    const char *compressedDcBuf      = compressedAcBuf +
                                  static_cast<ptrdiff_t>(acCompressedSize);
    const char *compressedRleBuf     = compressedDcBuf + 
                                  static_cast<ptrdiff_t>(dcCompressedSize);

    // 
    // Sanity check that the version is something we expect. Right now, 
    // we can decode version 0, 1, and 2. v1 adds 'end of block' symbols
    // to the AC RLE. v2 adds channel classification rules at the 
    // start of the data block.
    //

    if (version > 2)
        throw IEX_NAMESPACE::InputExc ("Invalid version of compressed data block");    

    setupChannelData(minX, minY, maxX, maxY);

    // 
    // Uncompress the UNKNOWN data into _planarUncBuffer[UNKNOWN]
    //

    if (unknownCompressedSize > 0)
    {
        if (unknownUncompressedSize > _planarUncBufferSize[UNKNOWN]) 
        {
            throw IEX_NAMESPACE::InputExc("Error uncompressing DWA data"
                                "(corrupt header).");
        }

        uLongf outSize = (uLongf)unknownUncompressedSize;

        if (Z_OK != ::uncompress
                        ((Bytef *)_planarUncBuffer[UNKNOWN],
                         &outSize,
                         (Bytef *)compressedUnknownBuf,
                         (uLong)unknownCompressedSize))
        {
            throw IEX_NAMESPACE::BaseExc("Error uncompressing UNKNOWN data.");
        }
    }

    // 
    // Uncompress the AC data into _packedAcBuffer
    //

    if (acCompressedSize > 0)
    {
        if ( !_packedAcBuffer || totalAcUncompressedCount*sizeof(unsigned short) > _packedAcBufferSize)
        {
            throw IEX_NAMESPACE::InputExc("Error uncompressing DWA data"
                                "(corrupt header).");
        }

        //
        // Don't trust the user to get it right, look in the file.
        //

        switch (acCompression)
        {
          case STATIC_HUFFMAN:

            hufUncompress
                (compressedAcBuf, 
                 (int)acCompressedSize, 
                 (unsigned short *)_packedAcBuffer, 
                 (int)totalAcUncompressedCount); 

            break;

          case DEFLATE:
            {
                uLongf destLen =
                    (int)(totalAcUncompressedCount) * sizeof (unsigned short);

                if (Z_OK != ::uncompress
                                ((Bytef *)_packedAcBuffer,
                                 &destLen,
                                 (Bytef *)compressedAcBuf,
                                 (uLong)acCompressedSize))
                {
                    throw IEX_NAMESPACE::InputExc ("Data decompression (zlib) failed.");
                }

                if (totalAcUncompressedCount * sizeof (unsigned short) !=
                                destLen)
                {
                    throw IEX_NAMESPACE::InputExc ("AC data corrupt.");     
                }
            }
            break;

          default:

            throw IEX_NAMESPACE::NoImplExc ("Unknown AC Compression");
            break;
        }
    }

    //
    // Uncompress the DC data into _packedDcBuffer
    //

    if (dcCompressedSize > 0)
    {
        if (totalDcUncompressedCount*sizeof(unsigned short) > _packedDcBufferSize)
        {
            throw IEX_NAMESPACE::InputExc("Error uncompressing DWA data"
                                "(corrupt header).");
        }

        if (static_cast<Int64>(_zip->uncompress
                    (compressedDcBuf, (int)dcCompressedSize, _packedDcBuffer))
            != totalDcUncompressedCount * sizeof (unsigned short))
        {
            throw IEX_NAMESPACE::BaseExc("DC data corrupt.");
        }
    }

    //
    // Uncompress the RLE data into _rleBuffer, then unRLE the results
    // into _planarUncBuffer[RLE]
    //

    if (rleRawSize > 0)
    {
        if (rleUncompressedSize > _rleBufferSize ||
            rleRawSize > _planarUncBufferSize[RLE])
        {
            throw IEX_NAMESPACE::InputExc("Error uncompressing DWA data"
                                "(corrupt header).");
        }
 
        uLongf dstLen = (uLongf)rleUncompressedSize;

        if (Z_OK != ::uncompress
                        ((Bytef *)_rleBuffer,
                         &dstLen,
                         (Bytef *)compressedRleBuf,
                         (uLong)rleCompressedSize))
        {
            throw IEX_NAMESPACE::BaseExc("Error uncompressing RLE data.");
        }

        if (dstLen != rleUncompressedSize)
            throw IEX_NAMESPACE::BaseExc("RLE data corrupted");

        if (static_cast<Int64>(rleUncompress
                ((int)rleUncompressedSize, 
                 (int)rleRawSize,
                 (signed char *)_rleBuffer,
                 _planarUncBuffer[RLE])) != rleRawSize)
        {        
            throw IEX_NAMESPACE::BaseExc("RLE data corrupted");
        }
    }

    //
    // Determine the start of each row in the output buffer
    //

    std::vector<bool> decodedChannels (_channelData.size());
    std::vector< std::vector<char *> > rowPtrs (_channelData.size());

    for (unsigned int chan = 0; chan < _channelData.size(); ++chan)
        decodedChannels[chan] = false;

    outBufferEnd = _outBuffer;

    for (int y = minY; y <= maxY; ++y)
    {
        for (unsigned int chan = 0; chan < _channelData.size(); ++chan)
        {
            ChannelData *cd = &_channelData[chan];

            if (IMATH_NAMESPACE::modp (y, cd->ySampling) != 0)
                continue;

            rowPtrs[chan].push_back (outBufferEnd);
            outBufferEnd += cd->width * OPENEXR_IMF_NAMESPACE::pixelTypeSize (cd->type);
        }
    }

    //
    // Setup to decode each block of 3 channels that need to
    // be handled together
    //

    for (unsigned int csc = 0; csc < _cscSets.size(); ++csc)
    {
        int rChan = _cscSets[csc].idx[0];    
        int gChan = _cscSets[csc].idx[1];    
        int bChan = _cscSets[csc].idx[2];    


        LossyDctDecoderCsc decoder
            (rowPtrs[rChan],
             rowPtrs[gChan],
             rowPtrs[bChan],
             packedAcBufferEnd,
             packedDcBufferEnd,
             dwaCompressorToLinear,
             _channelData[rChan].width,
             _channelData[rChan].height,
             _channelData[rChan].type,
             _channelData[gChan].type,
             _channelData[bChan].type);

        decoder.execute();

        packedAcBufferEnd +=
            decoder.numAcValuesEncoded() * sizeof (unsigned short);

        packedDcBufferEnd +=
            decoder.numDcValuesEncoded() * sizeof (unsigned short);

        decodedChannels[rChan] = true;
        decodedChannels[gChan] = true;
        decodedChannels[bChan] = true;
    }

    //
    // Setup to handle the remaining channels by themselves
    //

    for (unsigned int chan = 0; chan < _channelData.size(); ++chan)
    {
        if (decodedChannels[chan])
            continue;

        ChannelData *cd = &_channelData[chan];
        int pixelSize = OPENEXR_IMF_NAMESPACE::pixelTypeSize (cd->type);

        switch (cd->compression)
        {
          case LOSSY_DCT:

            //
            // Setup a single-channel lossy DCT decoder pointing
            // at the output buffer
            //

            {
                const unsigned short *linearLut = 0;

                if (!cd->pLinear)
                    linearLut = dwaCompressorToLinear;

                LossyDctDecoder decoder
                    (rowPtrs[chan],
                     packedAcBufferEnd,
                     packedDcBufferEnd,
                     linearLut,
                     cd->width,
                     cd->height,
                     cd->type);

                decoder.execute();   

                packedAcBufferEnd += 
                    decoder.numAcValuesEncoded() * sizeof (unsigned short);

                packedDcBufferEnd += 
                    decoder.numDcValuesEncoded() * sizeof (unsigned short);
            }

            break;

          case RLE:

            //
            // For the RLE case, the data has been un-RLE'd into
            // planarUncRleEnd[], but is still split out by bytes.
            // We need to rearrange the bytes back into the correct
            // order in the output buffer;
            //

            {
                int row = 0;

                for (int y = minY; y <= maxY; ++y)
                {
                    if (IMATH_NAMESPACE::modp (y, cd->ySampling) != 0)
                        continue;

                    char *dst = rowPtrs[chan][row];

                    if (pixelSize == 2)
                    {
                        interleaveByte2 (dst, 
                                         cd->planarUncRleEnd[0],
                                         cd->planarUncRleEnd[1],
                                         cd->width);
                                            
                        cd->planarUncRleEnd[0] += cd->width;
                        cd->planarUncRleEnd[1] += cd->width;
                    }
                    else
                    {
                        for (int x = 0; x < cd->width; ++x)
                        {
                            for (int byte = 0; byte < pixelSize; ++byte)
                            {
                               *dst++ = *cd->planarUncRleEnd[byte]++;
                            }
                        }
                    }

                    row++;
                }
            }

            break;

          case UNKNOWN:

            //
            // In the UNKNOWN case, data is already in planarUncBufferEnd
            // and just needs to copied over to the output buffer
            //

            {
                int row             = 0;
                int dstScanlineSize = cd->width * OPENEXR_IMF_NAMESPACE::pixelTypeSize (cd->type);

                for (int y = minY; y <= maxY; ++y)
                {
                    if (IMATH_NAMESPACE::modp (y, cd->ySampling) != 0)
                        continue;

                    //
                    // sanity check for buffer data lying within range
                    //
                    if ((cd->planarUncBufferEnd + static_cast<size_t>(dstScanlineSize))  > (_planarUncBuffer[UNKNOWN] + _planarUncBufferSize[UNKNOWN]) )
                    {
                        throw Iex::InputExc("DWA data corrupt");
                    }

                    memcpy (rowPtrs[chan][row],
                            cd->planarUncBufferEnd,
                            dstScanlineSize);

                    cd->planarUncBufferEnd += dstScanlineSize;
                    row++;
                }
            }

            break;

          default:

            throw IEX_NAMESPACE::NoImplExc ("Unhandled compression scheme case");
            break;
        }

        decodedChannels[chan] = true;
    }

    //
    // Return a ptr to _outBuffer
    //

    outPtr = _outBuffer;
    return (int)(outBufferEnd - _outBuffer);
}